

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::inner_loop<false>
               (single_learner *base,example *ec,uint32_t i,float cost,uint32_t *prediction,
               float *score,float *partial_prediction)

{
  example *in_RCX;
  uint in_EDX;
  long in_RSI;
  example *in_R8;
  undefined4 *in_R9;
  float in_stack_ffffffffffffffcc;
  
  LEARNER::learner<char,_example>::predict((learner<char,_example> *)in_RCX,in_R8,(size_t)in_R9);
  *in_R9 = *(undefined4 *)(in_RSI + 0x68a8);
  if ((*(float *)(in_RSI + 0x68a8) < *(float *)&(in_R8->super_example_predict).indices._begin) ||
     (((*(float *)(in_RSI + 0x68a8) == *(float *)&(in_R8->super_example_predict).indices._begin &&
       (!NAN(*(float *)(in_RSI + 0x68a8)) &&
        !NAN(*(float *)&(in_R8->super_example_predict).indices._begin))) &&
      (in_EDX < *(uint *)&(in_RCX->super_example_predict).indices._begin)))) {
    *(undefined4 *)&(in_R8->super_example_predict).indices._begin = *(undefined4 *)(in_RSI + 0x68a8)
    ;
    *(uint *)&(in_RCX->super_example_predict).indices._begin = in_EDX;
  }
  add_passthrough_feature_magic(in_RCX,(uint64_t)in_R8,(uint64_t)in_R9,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

inline void inner_loop(single_learner& base, example& ec, uint32_t i, float cost, uint32_t& prediction, float& score,
    float& partial_prediction)
{
  if (is_learn)
  {
    ec.weight = (cost == FLT_MAX) ? 0.f : 1.f;
    ec.l.simple.label = cost;
    base.learn(ec, i - 1);
  }
  else
    base.predict(ec, i - 1);

  partial_prediction = ec.partial_prediction;
  if (ec.partial_prediction < score || (ec.partial_prediction == score && i < prediction))
  {
    score = ec.partial_prediction;
    prediction = i;
  }
  add_passthrough_feature(ec, i, ec.partial_prediction);
}